

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-utils.cpp
# Opt level: O0

void setupStackTraceOnError(int argc,char **argv)

{
  PrettyStackTraceProgram X;
  char **in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  PrettyStackTraceProgram *in_stack_ffffffffffffffd0;
  StringRef local_20 [2];
  
  memset(local_20,0,0x10);
  llvm::StringRef::StringRef(local_20);
  llvm::sys::PrintStackTraceOnErrorSignal(local_20[0],false);
  llvm::PrettyStackTraceProgram::PrettyStackTraceProgram
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  llvm::PrettyStackTraceProgram::~PrettyStackTraceProgram((PrettyStackTraceProgram *)0x1c9786);
  return;
}

Assistant:

void setupStackTraceOnError(int argc, char *argv[]) {
#if LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 9
    llvm::sys::PrintStackTraceOnErrorSignal();
#else
    llvm::sys::PrintStackTraceOnErrorSignal(llvm::StringRef());
#endif
    llvm::PrettyStackTraceProgram X(argc, argv);
}